

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

vm_obj_id_t CVmObjLookupTable::create_from_stack(uchar **pc_ptr,uint argc)

{
  vm_obj_id_t vVar1;
  undefined4 in_ESI;
  vm_val_t *in_RDI;
  CVmObjLookupTable *unaff_retaddr;
  vm_val_t src_obj;
  size_t init_capacity;
  size_t bucket_count;
  vm_obj_id_t id;
  undefined4 in_stack_ffffffffffffffc8;
  vm_obj_id_t in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  size_t *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  size_t in_stack_ffffffffffffffe8;
  
  get_constructor_args
            (in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8,
             (size_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             (vm_val_t *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  vVar1 = vm_new_id(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  CVmObject::operator_new
            (CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc
            );
  CVmObjLookupTable((CVmObjLookupTable *)CONCAT44(in_ESI,vVar1),in_stack_ffffffffffffffe8,
                    CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  vm_objp(0);
  populate_from_list(unaff_retaddr,in_RDI);
  CVmStack::discard();
  return vVar1;
}

Assistant:

vm_obj_id_t CVmObjLookupTable::create_from_stack(
    VMG_ const uchar **pc_ptr, uint argc)
{
    vm_obj_id_t id;
    size_t bucket_count;
    size_t init_capacity;
    vm_val_t src_obj;

    /* parse the arguments */
    get_constructor_args(vmg_ argc, &bucket_count, &init_capacity, &src_obj);
    
    /* 
     *   allocate the object ID - this type of construction never creates a
     *   root object 
     */
    id = vm_new_id(vmg_ FALSE, TRUE, FALSE);

    /* create the object */
    new (vmg_ id) CVmObjLookupTable(vmg_ bucket_count, init_capacity);

    /* populate it with the source list if desired */
    ((CVmObjLookupTable *)vm_objp(vmg_ id))->
        populate_from_list(vmg_ &src_obj);

    /* discard the source object gc protection */
    G_stk->discard();

    /* return the new ID */
    return id;
}